

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_consume.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::cord_internal::Consume
          (cord_internal *this,CordRep *rep,
          FunctionRef<void_(absl::lts_20250127::cord_internal::CordRep_*,_unsigned_long,_unsigned_long)>
          consume_fn)

{
  cord_internal *pcVar1;
  uint uVar2;
  undefined8 uVar3;
  cord_internal *pcVar4;
  undefined8 uVar5;
  
  uVar3 = *(undefined8 *)this;
  if (this[0xc] == (cord_internal)0x1) {
    uVar5 = *(undefined8 *)(this + 0x10);
    pcVar4 = *(cord_internal **)(this + 0x18);
    if (*(int *)(this + 8) == 2) {
      operator_delete(this,0x20);
    }
    else {
      if (pcVar4 == (cord_internal *)0x0) {
        __assert_fail("rep != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
      }
      LOCK();
      *(int *)(pcVar4 + 8) = *(int *)(pcVar4 + 8) + 2;
      UNLOCK();
      LOCK();
      pcVar1 = this + 8;
      uVar2 = *(uint *)pcVar1;
      *(uint *)pcVar1 = *(uint *)pcVar1 - 2;
      UNLOCK();
      if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
        __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0xac,
                      "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
      }
      if (uVar2 == 2) {
        CordRep::Destroy((CordRep *)this);
      }
    }
  }
  else {
    uVar5 = 0;
    pcVar4 = this;
  }
  (*consume_fn.ptr_.fun)(rep,pcVar4,uVar5,uVar3,consume_fn.ptr_.fun);
  return;
}

Assistant:

void Consume(CordRep* rep,
             FunctionRef<void(CordRep*, size_t, size_t)> consume_fn) {
  size_t offset = 0;
  size_t length = rep->length;

  if (rep->tag == SUBSTRING) {
    offset += rep->substring()->start;
    rep = ClipSubstring(rep->substring());
  }
  consume_fn(rep, offset, length);
}